

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall LogFile::write_file(LogFile *this)

{
  int __fd;
  char *__s;
  size_type sVar1;
  reference ppcVar2;
  size_t __n;
  char *buff;
  LogFile *this_local;
  
  do {
    pthread_mutex_lock((pthread_mutex_t *)&this->get_Mutex);
    while (sVar1 = std::queue<char_*,_std::deque<char_*,_std::allocator<char_*>_>_>::size
                             (&this->WriteTask), sVar1 == 0) {
      pthread_cond_broadcast((pthread_cond_t *)&this->Swap_Cond);
      pthread_cond_wait((pthread_cond_t *)&this->get_Cond,(pthread_mutex_t *)&this->get_Mutex);
    }
    while (sVar1 = std::queue<char_*,_std::deque<char_*,_std::allocator<char_*>_>_>::size
                             (&this->WriteTask), sVar1 != 0) {
      ppcVar2 = std::queue<char_*,_std::deque<char_*,_std::allocator<char_*>_>_>::front
                          (&this->WriteTask);
      __s = *ppcVar2;
      std::queue<char_*,_std::deque<char_*,_std::allocator<char_*>_>_>::pop(&this->WriteTask);
      __fd = this->fd;
      __n = strlen(__s);
      write(__fd,__s,__n);
      if (__s != (char *)0x0) {
        operator_delete__(__s);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->get_Mutex);
  } while( true );
}

Assistant:

void LogFile::write_file()
{
    while(true)
    {
        pthread_mutex_lock(&get_Mutex);
        while(WriteTask.size() == 0)
        {
            pthread_cond_broadcast(&Swap_Cond);
            pthread_cond_wait(&get_Cond,&get_Mutex);
        }
        while(WriteTask.size() > 0)
        {
            char* buff = WriteTask.front();
            WriteTask.pop();
            //写日志文件
            write(fd,(void*)buff,strlen(buff));
            //cout<<"Write LogFile Success!"<<endl;
            delete[] buff;
        }
        pthread_mutex_unlock(&get_Mutex);
    }
}